

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  exception *ex;
  push_parser<printing_callbacks> parser;
  undefined1 local_3e0 [8];
  reader reader;
  istream_iterator<char,_char,_std::char_traits<char>,_long> local_290;
  istream_iterator<char,_char,_std::char_traits<char>,_long> local_280;
  string local_270 [8];
  string buffer;
  ifstream input;
  path input_name;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    boost::filesystem::path::path
              ((path *)&input.super_basic_ifstream<char,_std::char_traits<char>_>.field_0x200,
               argv[1]);
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)((long)&buffer.field_2 + 8),
               (path *)&input.super_basic_ifstream<char,_std::char_traits<char>_>.field_0x200);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&buffer.field_2 + *(long *)(buffer.field_2._8_8_ + -0x18) + 8))
    ;
    if (bVar1) {
      std::noskipws((ios_base *)
                    ((long)&buffer.field_2 + *(long *)(buffer.field_2._8_8_ + -0x18) + 8));
      std::istream_iterator<char,_char,_std::char_traits<char>,_long>::istream_iterator
                (&local_280,(istream_type *)((long)&buffer.field_2 + 8));
      std::istream_iterator<char,_char,_std::char_traits<char>,_long>::istream_iterator(&local_290);
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<std::istream_iterator<char,char,std::char_traits<char>,long>,void>
                (local_270,&local_280,&local_290,
                 (allocator<char> *)
                 ((long)&reader.stack.c.
                         super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&reader.stack.c.
                         super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      parser._328_8_ = std::__cxx11::string::operator_cast_to_basic_string_view(local_270);
      trial::protocol::json::basic_reader<char>::basic_reader
                ((basic_reader<char> *)local_3e0,(view_type *)&parser.field_0x148);
      example::push_parser<printing_callbacks>::push_parser
                ((push_parser<printing_callbacks> *)&ex,(reader *)local_3e0);
      example::push_parser<printing_callbacks>::parse((push_parser<printing_callbacks> *)&ex);
      example::push_parser<printing_callbacks>::~push_parser((push_parser<printing_callbacks> *)&ex)
      ;
      trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_3e0);
      std::__cxx11::string::~string(local_270);
    }
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)((long)&buffer.field_2 + 8));
    boost::filesystem::path::~path
              ((path *)&input.super_basic_ifstream<char,_std::char_traits<char>_>.field_0x200);
    argv_local._4_4_ = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," <file>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    try
    {
        if (argc != 2)
        {
            std::cerr << "Usage: " << argv[0] << " <file>" << std::endl;
            return 1;
        }

        boost::filesystem::path input_name(argv[1]);
        boost::filesystem::ifstream input(input_name);
        if (input)
        {
            std::noskipws(input);
            std::string buffer((std::istream_iterator<char>(input)),
                               (std::istream_iterator<char>()));

            json::reader reader(buffer);
            example::push_parser<printing_callbacks> parser(reader);
            parser.parse();
        }
    }
    catch (const std::exception& ex)
    {
        std::cout << "Error: " << ex.what() << std::endl;
    }
    return 0;
}